

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZendParser.cpp
# Opt level: O3

bool __thiscall phpconvert::ZendParser::isKeyword(ZendParser *this,string *tmpClassNameLower)

{
  iterator iVar1;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&this->keywords->_M_t,tmpClassNameLower);
  return (_Rb_tree_header *)iVar1._M_node != &(this->keywords->_M_t)._M_impl.super__Rb_tree_header;
}

Assistant:

bool ZendParser::isKeyword(const string &tmpClassNameLower) {
        return keywords->find(tmpClassNameLower)
               != keywords->end();
    }